

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  ImGuiContext *pIVar5;
  float *pfVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (w_full <= 0.0) {
    w_full = CalcItemWidth();
  }
  iVar9 = components + -1;
  fVar13 = (pIVar5->Style).ItemInnerSpacing.x;
  fVar11 = (float)(int)((w_full - fVar13 * (float)iVar9) / (float)components);
  fVar12 = 1.0;
  if (1.0 <= fVar11) {
    fVar12 = fVar11;
  }
  fVar11 = (float)(int)(w_full - (fVar13 + fVar12) * (float)iVar9);
  fVar13 = 1.0;
  if (1.0 <= fVar11) {
    fVar13 = fVar11;
  }
  iVar10 = (pIVar3->DC).ItemWidthStack.Size;
  iVar2 = (pIVar3->DC).ItemWidthStack.Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    if (iVar2 < iVar10) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar6,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if (pfVar4 != (float *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
      }
      (pIVar3->DC).ItemWidthStack.Data = pfVar6;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
    }
  }
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = fVar13;
  pIVar1 = &(pIVar3->DC).ItemWidthStack;
  pIVar1->Size = pIVar1->Size + 1;
  if (1 < components) {
    do {
      iVar10 = (pIVar3->DC).ItemWidthStack.Size;
      iVar2 = (pIVar3->DC).ItemWidthStack.Capacity;
      if (iVar10 == iVar2) {
        if (iVar2 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar2 / 2 + iVar2;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar2 < iVar10) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
          pfVar6 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if (pfVar4 != (float *)0x0) {
            memcpy(pfVar6,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
            pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
            if (pfVar4 != (float *)0x0) {
              GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
            }
            (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
          }
          (pIVar3->DC).ItemWidthStack.Data = pfVar6;
          (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
        }
      }
      (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = fVar12;
      pIVar1 = &(pIVar3->DC).ItemWidthStack;
      pIVar1->Size = pIVar1->Size + 1;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  lVar7 = (long)(pIVar3->DC).ItemWidthStack.Size;
  if (0 < lVar7) {
    (pIVar3->DC).ItemWidth = (pIVar3->DC).ItemWidthStack.Data[lVar7 + -1];
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,"value_type &ImVector<float>::back() [T = float]");
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}